

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void __thiscall TTD::TextFormatWriter::WriteSeparator(TextFormatWriter *this,Separator separator)

{
  Separator SVar1;
  uint local_1c;
  uint local_18;
  uint32 i_1;
  uint32 i;
  Separator separator_local;
  TextFormatWriter *this_local;
  
  SVar1 = NSTokens::operator&(separator,CommaSeparator);
  if (SVar1 == CommaSeparator) {
    FileWriter::WriteRawChar(&this->super_FileWriter,L',');
    SVar1 = NSTokens::operator&(separator,BigSpaceSeparator);
    if (SVar1 == BigSpaceSeparator) {
      FileWriter::WriteRawChar(&this->super_FileWriter,L'\n');
      for (local_18 = 0; local_18 < this->m_indentSize; local_18 = local_18 + 1) {
        FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
        FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
      }
    }
    else {
      FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
    }
  }
  if (separator == BigSpaceSeparator) {
    FileWriter::WriteRawChar(&this->super_FileWriter,L'\n');
    for (local_1c = 0; local_1c < this->m_indentSize; local_1c = local_1c + 1) {
      FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
      FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
    }
  }
  return;
}

Assistant:

void TextFormatWriter::WriteSeparator(NSTokens::Separator separator)
    {
        if((separator & NSTokens::Separator::CommaSeparator) == NSTokens::Separator::CommaSeparator)
        {
            this->WriteRawChar(_u(','));

            if((separator & NSTokens::Separator::BigSpaceSeparator) == NSTokens::Separator::BigSpaceSeparator)
            {
                this->WriteRawChar(_u('\n'));
                for(uint32 i = 0; i < this->m_indentSize; ++i)
                {
                    this->WriteRawChar(_u(' '));
                    this->WriteRawChar(_u(' '));
                }
            }
            else
            {
                this->WriteRawChar(_u(' '));
            }
        }

        if(separator == NSTokens::Separator::BigSpaceSeparator)
        {
            this->WriteRawChar(_u('\n'));
            for(uint32 i = 0; i < this->m_indentSize; ++i)
            {
                this->WriteRawChar(_u(' '));
                this->WriteRawChar(_u(' '));
            }
        }
    }